

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64_t __thiscall
google::protobuf::internal::ThreadSafeArena::SpaceAllocated(ThreadSafeArena *this)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  __pointer_type this_00;
  Span<const_std::atomic<google::protobuf::internal::SerialArena_*>_> SVar4;
  
  uVar3 = (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
  this_00 = (this->head_)._M_b._M_p;
  while( true ) {
    if (((ulong)this_00 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_00 + 8) == 0) break;
    SVar4 = SerialArenaChunk::arenas(this_00);
    if (SVar4.len_ != 0) {
      lVar2 = 0;
      do {
        lVar1 = *(long *)((long)&((SVar4.ptr_)->_M_b)._M_p + lVar2);
        if (lVar1 != 0) {
          uVar3 = uVar3 + *(long *)(lVar1 + 0x58);
        }
        lVar2 = lVar2 + 8;
      } while (SVar4.len_ * 8 != lVar2);
    }
    this_00 = *(__pointer_type *)this_00;
  }
  return uVar3;
}

Assistant:

bool insert(void* me, SerialArena* serial) {
    uint32_t idx = size().fetch_add(1, std::memory_order_relaxed);
    // Bail out if this chunk is full.
    if (idx >= capacity()) {
      // Write old value back to avoid potential overflow.
      size().store(capacity(), std::memory_order_relaxed);
      return false;
    }

    id(idx).store(me, std::memory_order_relaxed);
    arena(idx).store(serial, std::memory_order_release);
    return true;
  }